

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token)

{
  bool bVar1;
  Value *pVVar2;
  long in_RSI;
  Value *in_RDI;
  Value decoded;
  Value *in_stack_000000d8;
  Token *in_stack_000000e0;
  Reader *in_stack_000000e8;
  Value *in_stack_ffffffffffffff58;
  Value *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  Value *in_stack_ffffffffffffff90;
  Value *in_stack_ffffffffffffffb8;
  Value *in_stack_ffffffffffffffc0;
  
  Value::Value(in_RDI,(ValueType)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  bVar1 = decodeDouble(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  if (bVar1) {
    Value::Value(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    currentValue((Reader *)0x124a3f);
    Value::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Value::~Value(in_stack_ffffffffffffff90);
    pVVar2 = currentValue((Reader *)0x124a6b);
    Value::setOffsetStart(pVVar2,*(long *)(in_RSI + 8) - in_RDI[4].limit_);
    pVVar2 = currentValue((Reader *)0x124aa3);
    Value::setOffsetLimit(pVVar2,*(long *)(in_RSI + 0x10) - in_RDI[4].limit_);
  }
  Value::~Value(in_stack_ffffffffffffff90);
  return bVar1;
}

Assistant:

bool Reader::decodeDouble(Token& token) {
  Value decoded;
  if (!decodeDouble(token, decoded))
    return false;
  currentValue() = decoded;
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}